

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall
perfetto::ipc::ServiceProxy::ServiceProxy(ServiceProxy *this,EventListener *event_listener)

{
  _Rb_tree_header *p_Var1;
  
  this->_vptr_ServiceProxy = (_func_int **)&PTR__ProducerPortProxy_003a3b68;
  p_Var1 = &(this->remote_method_ids_)._M_t._M_impl.super__Rb_tree_header;
  (this->remote_method_ids_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->remote_method_ids_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->client_).handle_.super___shared_ptr<perfetto::ipc::Client_*,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->client_).handle_.super___shared_ptr<perfetto::ipc::Client_*,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->service_id_ = 0;
  (this->remote_method_ids_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->remote_method_ids_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->remote_method_ids_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->pending_callbacks_)._M_t._M_impl.super__Rb_tree_header;
  (this->pending_callbacks_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->pending_callbacks_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->pending_callbacks_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->pending_callbacks_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->pending_callbacks_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->event_listener_ = event_listener;
  base::WeakPtrFactory<perfetto::ipc::ServiceProxy>::WeakPtrFactory(&this->weak_ptr_factory_,this);
  return;
}

Assistant:

ServiceProxy::ServiceProxy(EventListener* event_listener)
    : event_listener_(event_listener), weak_ptr_factory_(this) {}